

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O2

LPSTR GetEnvironmentStringsA(void)

{
  char *__s;
  char **ppcVar1;
  size_t sVar2;
  LPSTR pCVar3;
  int iVar4;
  LPSTR __dest;
  int iVar5;
  
  if (PAL_InitializeChakraCoreCalled) {
    PALCEnterCriticalSection(&gcsEnvironment);
    ppcVar1 = palEnvironment;
    iVar4 = 0;
    for (iVar5 = 0; ppcVar1[iVar5] != (char *)0x0; iVar5 = iVar5 + 1) {
      sVar2 = strlen(ppcVar1[iVar5]);
      iVar4 = iVar4 + (int)sVar2 + 1;
    }
    pCVar3 = (LPSTR)PAL_malloc((long)(iVar4 + 1));
    if (pCVar3 == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032ed78;
      SetLastError(8);
    }
    else {
      __dest = pCVar3;
      for (iVar4 = 0; __s = palEnvironment[iVar4], __s != (char *)0x0; iVar4 = iVar4 + 1) {
        sVar2 = strlen(__s);
        sVar2 = (size_t)((int)sVar2 + 1);
        memcpy(__dest,__s,sVar2);
        __dest = __dest + sVar2;
      }
      *__dest = '\0';
    }
    PALCLeaveCriticalSection(&gcsEnvironment);
    if (PAL_InitializeChakraCoreCalled != false) {
      return pCVar3;
    }
  }
LAB_0032ed78:
  abort();
}

Assistant:

LPSTR
PALAPI
GetEnvironmentStringsA(
               VOID)
{
    char *environ = NULL, *tempEnviron;
    int i, len, envNum;

    PERF_ENTRY(GetEnvironmentStringsA);
    ENTRY("GetEnvironmentStringsA()\n");

    PALCEnterCriticalSection(&gcsEnvironment);    

    envNum = 0;
    len    = 0;

    /* get total length of the bytes that we need to allocate */
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = strlen(palEnvironment[i]) + 1;
        envNum += len;
    }

    environ = (char *)PAL_malloc(envNum + 1);
    if (environ == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto EXIT;
    }

    len = 0;
    tempEnviron = environ;
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = strlen(palEnvironment[i]) + 1;
        memcpy(tempEnviron, palEnvironment[i], len);
        tempEnviron += len;
        envNum      -= len;
    }

    *tempEnviron = 0; /* Put an extra NULL at the end */
    
 EXIT:
    PALCLeaveCriticalSection(&gcsEnvironment);

    LOGEXIT("GetEnvironmentStringsA returning %p\n", environ);
    PERF_EXIT(GetEnvironmentStringsA);
    return environ;
}